

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::noteDefaultClocking
          (Compilation *this,Scope *scope,Symbol *clocking,SourceRange range)

{
  group_type_pointer pgVar1;
  size_t *psVar2;
  undefined4 uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  int iVar6;
  undefined1 auVar7 [16];
  SourceRange sourceRange;
  ulong uVar8;
  bool bVar9;
  ulong pos0;
  Diagnostic *this_00;
  SourceLocation SVar10;
  pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*> *ppVar11;
  uint uVar12;
  SourceLocation SVar13;
  ulong uVar14;
  ulong hash;
  pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*> *ppVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  undefined1 auVar20 [16];
  try_emplace_args_t local_89;
  flat_hash_map<const_Symbol_*,_const_Symbol_*> *local_88;
  Symbol *local_80;
  Symbol *inst;
  ulong local_70;
  ulong local_68;
  Scope *local_60;
  SourceLocation local_58;
  SourceLocation local_50;
  locator res;
  
  SVar13 = range.endLoc;
  SVar10 = range.startLoc;
  bVar9 = Scope::isUninstantiated(scope);
  if ((!bVar9) && (inst = Scope::getContainingInstanceOrChecker(scope), inst != (Symbol *)0x0)) {
    local_88 = &this->defaultClockingMap;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = inst;
    hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(this->defaultClockingMap).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
                          .arrays.groups_size_index & 0x3f);
    pgVar4 = (this->defaultClockingMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
             .arrays.groups_;
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    ppVar5 = (this->defaultClockingMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
             .arrays.elements_;
    local_70 = (this->defaultClockingMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
               .arrays.groups_size_mask;
    uVar8 = 0;
    uVar14 = pos0;
    do {
      local_68 = uVar8;
      pgVar1 = pgVar4 + uVar14;
      uVar16 = (uchar)uVar3;
      auVar20[0] = -(pgVar1->m[0].n == uVar16);
      uVar17 = (uchar)((uint)uVar3 >> 8);
      auVar20[1] = -(pgVar1->m[1].n == uVar17);
      uVar18 = (uchar)((uint)uVar3 >> 0x10);
      auVar20[2] = -(pgVar1->m[2].n == uVar18);
      uVar19 = (uchar)((uint)uVar3 >> 0x18);
      auVar20[3] = -(pgVar1->m[3].n == uVar19);
      auVar20[4] = -(pgVar1->m[4].n == uVar16);
      auVar20[5] = -(pgVar1->m[5].n == uVar17);
      auVar20[6] = -(pgVar1->m[6].n == uVar18);
      auVar20[7] = -(pgVar1->m[7].n == uVar19);
      auVar20[8] = -(pgVar1->m[8].n == uVar16);
      auVar20[9] = -(pgVar1->m[9].n == uVar17);
      auVar20[10] = -(pgVar1->m[10].n == uVar18);
      auVar20[0xb] = -(pgVar1->m[0xb].n == uVar19);
      auVar20[0xc] = -(pgVar1->m[0xc].n == uVar16);
      auVar20[0xd] = -(pgVar1->m[0xd].n == uVar17);
      auVar20[0xe] = -(pgVar1->m[0xe].n == uVar18);
      auVar20[0xf] = -(pgVar1->m[0xf].n == uVar19);
      for (uVar12 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe); uVar12 != 0;
          uVar12 = uVar12 - 1 & uVar12) {
        iVar6 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        if (inst == *(Symbol **)((long)&ppVar5[uVar14 * 0xf].first + (ulong)(uint)(iVar6 << 4))) {
          ppVar15 = (pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*> *)
                    ((long)&ppVar5[uVar14 * 0xf].first + (ulong)(uint)(iVar6 << 4));
          goto LAB_002a4e2b;
        }
      }
      if ((pgVar4[uVar14].m[0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
      uVar14 = uVar14 + local_68 + 1 & local_70;
      uVar8 = local_68 + 1;
    } while (local_68 + 1 <= local_70);
    ppVar15 = (pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*> *)0x0;
LAB_002a4e2b:
    ppVar11 = ppVar15;
    local_80 = clocking;
    local_60 = scope;
    local_58 = SVar10;
    local_50 = SVar13;
    if (ppVar15 == (pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*> *)0x0) {
      if ((this->defaultClockingMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
          .size_ctrl.size <
          (this->defaultClockingMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Symbol_const*>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,slang::ast::Symbol_const*>
                  (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Symbol_const*>>>
                         *)local_88,(arrays_type *)local_88,pos0,hash,&local_89,&inst,&local_80);
        psVar2 = &(this->defaultClockingMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
                  .size_ctrl.size;
        *psVar2 = *psVar2 + 1;
        ppVar11 = res.p;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Symbol_const*>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,slang::ast::Symbol_const*>
                  (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Symbol_const*>>>
                         *)local_88,hash,&local_89,&inst,&local_80);
        ppVar11 = res.p;
      }
    }
    sourceRange.endLoc = local_50;
    sourceRange.startLoc = local_58;
    if (ppVar15 != (pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*> *)0x0) {
      this_00 = Scope::addDiag(local_60,(DiagCode)0x15000d,sourceRange);
      Diagnostic::addNote(this_00,(DiagCode)0xa0001,ppVar11->second->location);
    }
  }
  return;
}

Assistant:

void Compilation::noteDefaultClocking(const Scope& scope, const Symbol& clocking,
                                      SourceRange range) {
    SLANG_ASSERT(!isFrozen());

    if (scope.isUninstantiated())
        return;

    // The LRM is not clear about this, but this Accellera issue states
    // that default clocking declarations inside child scopes actually
    // belong to the parent instance body. Only VCS implements this correctly,
    // other tools treat it the way you'd naturally expect.
    // https://accellera.mantishub.io/view.php?id=3515

    auto inst = scope.getContainingInstanceOrChecker();
    if (inst) {
        auto [it, inserted] = defaultClockingMap.emplace(inst, &clocking);
        if (!inserted) {
            auto& diag = scope.addDiag(diag::MultipleDefaultClocking, range);
            diag.addNote(diag::NotePreviousDefinition, it->second->location);
        }
    }
}